

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hxx
# Opt level: O0

Solution * lineage::loadSolution(string *fileName)

{
  bool bVar1;
  long *plVar2;
  undefined8 in_RSI;
  Solution *in_RDI;
  size_t edgeLabel;
  ifstream file;
  Solution *solution;
  value_type_conflict2 *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  ulong local_238 [3];
  istream local_220 [527];
  byte local_11;
  undefined8 local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  Solution::Solution((Solution *)0x138161);
  std::ifstream::ifstream(local_220,local_10,8);
  local_238[0] = 0;
  while( true ) {
    plVar2 = (long *)std::istream::operator>>(local_220,local_238);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98);
  }
  std::ifstream::close();
  local_11 = 1;
  std::ifstream::~ifstream(local_220);
  if ((local_11 & 1) == 0) {
    Solution::~Solution((Solution *)0x138234);
  }
  return in_RDI;
}

Assistant:

inline
Solution loadSolution(std::string const& fileName)
{
    Solution solution;

    std::ifstream file(fileName);
    
    size_t edgeLabel = 0;
    while (file >> edgeLabel)
        solution.edge_labels.push_back(edgeLabel);
    
    file.close();

    return solution;
}